

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O0

_Bool ascon_hasha_xof_matches
                (uint8_t *expected_digest,uint8_t *data,size_t expected_digest_len,size_t data_len)

{
  _Bool _Var1;
  ascon_hash_ctx_t ctx;
  uint8_t *in_stack_ffffffffffffff98;
  ascon_hash_ctx_t *in_stack_ffffffffffffffa0;
  
  ascon_hasha_xof_init((ascon_hash_ctx_t *)0x1053e2);
  ascon_hasha_xof_update(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1053f6);
  _Var1 = ascon_hasha_xof_final_matches
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x10540a);
  return _Var1;
}

Assistant:

ASCON_API bool
ascon_hasha_xof_matches(const uint8_t* const expected_digest,
                        const uint8_t* const data,
                        const size_t expected_digest_len,
                        const size_t data_len)
{
    ASCON_ASSERT(expected_digest_len == 0 || expected_digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hasha_xof_init(&ctx);
    ascon_hasha_xof_update(&ctx, data, data_len);
    return ascon_hasha_xof_final_matches(&ctx, expected_digest, expected_digest_len);
}